

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

void page_to_char(char *txt,CHAR_DATA *ch)

{
  size_t sVar1;
  void *pvVar2;
  long in_RSI;
  CHAR_DATA *in_RDI;
  char *unaff_retaddr;
  char *in_stack_00005a28;
  descriptor_data *in_stack_00005a30;
  
  if ((in_RDI != (CHAR_DATA *)0x0) && (*(long *)(in_RSI + 0x80) != 0)) {
    if (*(int *)(in_RSI + 0x140) == 0) {
      send_to_char(unaff_retaddr,in_RDI);
    }
    else {
      sVar1 = strlen((char *)in_RDI);
      pvVar2 = operator_new__(sVar1 + 1);
      *(void **)(*(long *)(in_RSI + 0x80) + 0x6c50) = pvVar2;
      strcpy(*(char **)(*(long *)(in_RSI + 0x80) + 0x6c50),(char *)in_RDI);
      *(undefined8 *)(*(long *)(in_RSI + 0x80) + 0x6c58) =
           *(undefined8 *)(*(long *)(in_RSI + 0x80) + 0x6c50);
      show_string(in_stack_00005a30,in_stack_00005a28);
    }
  }
  return;
}

Assistant:

void page_to_char(const char *txt, CHAR_DATA *ch)
{
	if (txt == nullptr || ch->desc == nullptr)
		return;

	if (ch->lines == 0)
	{
		send_to_char(txt, ch);
		return;
	}

	ch->desc->showstr_head = new char[strlen(txt) + 1];
	strcpy(ch->desc->showstr_head, txt);

	ch->desc->showstr_point = ch->desc->showstr_head;
	show_string(ch->desc, "");
}